

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstring.cpp
# Opt level: O0

void __thiscall TPZString::TPZString(TPZString *this,char *source)

{
  char *__dest;
  size_t sVar1;
  size_t __n;
  char *in_RSI;
  TPZVec<char> *in_RDI;
  size_t len;
  
  TPZStack<char,_10>::TPZStack((TPZStack<char,_10> *)in_RDI);
  (((TPZManVector<char,_10> *)&in_RDI->_vptr_TPZVec)->super_TPZVec<char>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZString_023d2ef0;
  sVar1 = strlen(in_RSI);
  (*(((TPZManVector<char,_10> *)&in_RDI->_vptr_TPZVec)->super_TPZVec<char>)._vptr_TPZVec[3])
            (in_RDI,sVar1 + 1);
  __dest = in_RDI->fStore;
  __n = TPZVec<char>::NElements(in_RDI);
  strncpy(__dest,in_RSI,__n);
  in_RDI->fStore[sVar1] = '\0';
  return;
}

Assistant:

TPZString::TPZString(char const * source)
{
	size_t len = strlen(source);
	Resize(len + 1);
	strncpy(fStore, source, NElements());
	
	// although the TPZStack class already stores the length, the null
	// character is necessary to export string as a null character
	// ended string
	fStore[len] = '\0';
}